

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_elements_transaction.cpp
# Opt level: O0

ConfidentialTransactionController * __thiscall
cfd::api::ElementsTransactionApi::CreateRawTransaction
          (ElementsTransactionApi *this,uint32_t version,uint32_t locktime,
          vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_> *txins,
          vector<cfd::api::TxInPeginParameters,_std::allocator<cfd::api::TxInPeginParameters>_>
          *pegins,vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
                  *txouts,
          vector<cfd::api::TxOutPegoutParameters,_std::allocator<cfd::api::TxOutPegoutParameters>_>
          *pegouts,ConfidentialTxOut *txout_fee,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
          *pegout_addresses)

{
  ConfidentialTransactionController *in_RDI;
  ConfidentialTransactionController *in_stack_00000018;
  ConfidentialTransactionController ctxc;
  vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
  *in_stack_00000ca8;
  vector<cfd::api::TxInPeginParameters,_std::allocator<cfd::api::TxInPeginParameters>_>
  *in_stack_00000cb0;
  vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
  *in_stack_00000cb8;
  string *in_stack_00000cc0;
  ElementsTransactionApi *in_stack_00000cc8;
  vector<cfd::api::TxOutPegoutParameters,_std::allocator<cfd::api::TxOutPegoutParameters>_>
  *in_stack_00000d00;
  ConfidentialTxOut *in_stack_00000d08;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
  *in_stack_00000d10;
  AbstractTransactionController *in_stack_ffffffffffffff18;
  undefined8 in_stack_ffffffffffffff28;
  ConfidentialTransactionController *in_stack_ffffffffffffff30;
  string local_98 [152];
  
  ConfidentialTransactionController::ConfidentialTransactionController
            (in_stack_ffffffffffffff30,(uint32_t)((ulong)in_stack_ffffffffffffff28 >> 0x20),
             (uint32_t)in_stack_ffffffffffffff28);
  AbstractTransactionController::GetHex_abi_cxx11_(in_stack_ffffffffffffff18);
  AddRawTransaction(in_stack_00000cc8,in_stack_00000cc0,in_stack_00000cb8,in_stack_00000cb0,
                    in_stack_00000ca8,in_stack_00000d00,in_stack_00000d08,in_stack_00000d10);
  std::__cxx11::string::~string(local_98);
  ConfidentialTransactionController::~ConfidentialTransactionController(in_stack_00000018);
  return in_RDI;
}

Assistant:

ConfidentialTransactionController ElementsTransactionApi::CreateRawTransaction(
    uint32_t version, uint32_t locktime,
    const std::vector<ConfidentialTxIn>& txins,
    const std::vector<TxInPeginParameters>& pegins,
    const std::vector<ConfidentialTxOut>& txouts,
    const std::vector<TxOutPegoutParameters>& pegouts,
    const ConfidentialTxOut& txout_fee,
    std::map<std::string, Amount>* pegout_addresses) const {
  ConfidentialTransactionController ctxc(version, locktime);
  return AddRawTransaction(
      ctxc.GetHex(), txins, pegins, txouts, pegouts, txout_fee,
      pegout_addresses);
}